

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int x9_62_on_exchange(ptls_key_exchange_context_t **_ctx,int release,ptls_iovec_t *secret,
                     ptls_iovec_t peerkey)

{
  st_x9_62_keyex_context_t *ctx_00;
  EC_GROUP *group_00;
  int local_4c;
  EC_POINT *pEStack_48;
  int ret;
  EC_POINT *peer_point;
  EC_GROUP *group;
  st_x9_62_keyex_context_t *ctx;
  ptls_iovec_t *secret_local;
  int release_local;
  ptls_key_exchange_context_t **_ctx_local;
  ptls_iovec_t peerkey_local;
  
  ctx_00 = (st_x9_62_keyex_context_t *)*_ctx;
  group_00 = EC_KEY_get0_group((EC_KEY *)ctx_00->privkey);
  pEStack_48 = (EC_POINT *)0x0;
  if (secret == (ptls_iovec_t *)0x0) {
    local_4c = 0;
  }
  else {
    pEStack_48 = x9_62_decode_point((EC_GROUP *)group_00,peerkey,ctx_00->bn_ctx);
    if (pEStack_48 == (EC_POINT *)0x0) {
      local_4c = 0x32;
    }
    else {
      local_4c = ecdh_calc_secret(secret,(EC_GROUP *)group_00,ctx_00->privkey,pEStack_48);
    }
  }
  if (pEStack_48 != (EC_POINT *)0x0) {
    EC_POINT_free((EC_POINT *)pEStack_48);
  }
  if (release != 0) {
    x9_62_free_context(ctx_00);
    *_ctx = (ptls_key_exchange_context_t *)0x0;
  }
  return local_4c;
}

Assistant:

static int x9_62_on_exchange(ptls_key_exchange_context_t **_ctx, int release, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    struct st_x9_62_keyex_context_t *ctx = (struct st_x9_62_keyex_context_t *)*_ctx;
    const EC_GROUP *group = EC_KEY_get0_group(ctx->privkey);
    EC_POINT *peer_point = NULL;
    int ret;

    if (secret == NULL) {
        ret = 0;
        goto Exit;
    }

    if ((peer_point = x9_62_decode_point(group, peerkey, ctx->bn_ctx)) == NULL) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    if ((ret = ecdh_calc_secret(secret, group, ctx->privkey, peer_point)) != 0)
        goto Exit;

Exit:
    if (peer_point != NULL)
        EC_POINT_free(peer_point);
    if (release) {
        x9_62_free_context(ctx);
        *_ctx = NULL;
    }
    return ret;
}